

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knetfile.c
# Opt level: O0

ssize_t knet_read(knetFile *fp,void *buf,size_t len)

{
  ssize_t sVar1;
  int *piVar2;
  bool bVar3;
  ssize_t curr;
  size_t rest;
  off_t l;
  size_t len_local;
  void *buf_local;
  knetFile *fp_local;
  
  rest = 0;
  if (fp->fd == -1) {
    fp_local = (knetFile *)0x0;
  }
  else {
    if (fp->type == 2) {
      if (fp->is_ready == 0) {
        if (fp->no_reconnect == 0) {
          kftp_reconnect(fp);
        }
        kftp_connect_file(fp);
      }
    }
    else if ((fp->type == 3) && (fp->is_ready == 0)) {
      khttp_connect_file(fp);
    }
    curr = len;
    if (fp->type == 1) {
      for (; curr != 0; curr = curr - sVar1) {
        do {
          sVar1 = read(fp->fd,(void *)((long)buf + rest),curr);
          bVar3 = false;
          if (sVar1 < 0) {
            piVar2 = __errno_location();
            bVar3 = *piVar2 == 4;
          }
        } while (bVar3);
        if (sVar1 < 0) {
          return -1;
        }
        if (sVar1 == 0) break;
        rest = sVar1 + rest;
      }
    }
    else {
      rest = my_netread(fp->fd,buf,len);
    }
    fp->offset = rest + fp->offset;
    fp_local = (knetFile *)rest;
  }
  return (ssize_t)fp_local;
}

Assistant:

ssize_t knet_read(knetFile *fp, void *buf, size_t len)
{
	off_t l = 0;
	if (fp->fd == -1) return 0;
	if (fp->type == KNF_TYPE_FTP) {
		if (fp->is_ready == 0) {
			if (!fp->no_reconnect) kftp_reconnect(fp);
			kftp_connect_file(fp);
		}
	} else if (fp->type == KNF_TYPE_HTTP) {
		if (fp->is_ready == 0)
			khttp_connect_file(fp);
	}
	if (fp->type == KNF_TYPE_LOCAL) { // on Windows, the following block is necessary; not on UNIX
		size_t rest = len;
		ssize_t curr;
		while (rest) {
			do {
				curr = read(fp->fd, (void*)((char*)buf + l), rest);
			} while (curr < 0 && EINTR == errno);
			if (curr < 0) return -1;
			if (curr == 0) break;
			l += curr; rest -= curr;
		}
	} else l = my_netread(fp->fd, buf, len);
	fp->offset += l;
	return l;
}